

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_if.c
# Opt level: O2

void expr_list(t_expr *x,t_symbol *s,int argc,t_atom *argv)

{
  ex_ex *optr;
  long lVar1;
  uint uVar2;
  word wVar3;
  _outlet *x_00;
  ulong uVar4;
  long lVar5;
  word *pwVar6;
  t_float f;
  
  uVar2 = 100;
  if (argc < 100) {
    uVar2 = argc;
  }
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = 0;
  }
  pwVar6 = &argv->a_w;
  for (lVar5 = 0; uVar4 * 0x18 - lVar5 != 0; lVar5 = lVar5 + 0x18) {
    if ((float)((t_atom *)(pwVar6 + -1))->a_type == 2.8026e-45) {
      lVar1 = *(long *)((long)&x->exp_var[0].ex_type + lVar5);
      if (lVar1 != 0) {
        if (lVar1 == 0xd) {
          wVar3 = *pwVar6;
          goto LAB_001961cf;
        }
LAB_001961bb:
        pd_error(x,"expr: type mismatch");
      }
    }
    else if (((float)((t_atom *)(pwVar6 + -1))->a_type == 1.4013e-45) &&
            (lVar1 = *(long *)((long)&x->exp_var[0].ex_type + lVar5), lVar1 != 0)) {
      if (lVar1 == 0xb) {
        wVar3 = (word)(long)pwVar6->w_float;
LAB_001961cf:
        *(word *)((long)&x->exp_var[0].ex_cont + lVar5) = wVar3;
      }
      else {
        if (lVar1 != 0xc) goto LAB_001961bb;
        *(t_float *)((long)&x->exp_var[0].ex_cont + lVar5) = pwVar6->w_float;
      }
    }
    pwVar6 = pwVar6 + 2;
  }
  if ((x->exp_flags & 6) == 0) {
    uVar4 = (ulong)(uint)x->exp_nexpr;
    lVar5 = uVar4 * 0x18 + 0xfe0;
    for (; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
      optr = (ex_ex *)((long)x->exp_outlet + lVar5 + -0x50);
      ex_eval(x,x->exp_stack[uVar4 - 1],optr,0);
      lVar1 = *(long *)((long)x->exp_outlet + lVar5 + -0x48);
      if (lVar1 == 2) {
        x_00 = x->exp_outlet[uVar4 - 1];
        f = (optr->ex_cont).v_flt;
LAB_0019624c:
        outlet_float(x_00,f);
      }
      else {
        if (lVar1 == 1) {
          x_00 = x->exp_outlet[uVar4 - 1];
          f = (t_float)(optr->ex_cont).v_int;
          goto LAB_0019624c;
        }
        post("expr: bang: unrecognized result %ld\n");
      }
      lVar5 = lVar5 + -0x18;
    }
  }
  return;
}

Assistant:

static void
expr_list(t_expr *x, t_symbol *s, int argc, const fts_atom_t *argv)
{
        int i;

        if (argc > MAX_VARS) argc = MAX_VARS;

        for (i = 0; i < argc; i++)
        {
                if (argv[i].a_type == A_FLOAT)
                {
                        if (x->exp_var[i].ex_type == ET_FI)
                                x->exp_var[i].ex_flt = argv[i].a_w.w_float;
                        else if (x->exp_var[i].ex_type == ET_II)
                                x->exp_var[i].ex_int = argv[i].a_w.w_float;
                        else if (x->exp_var[i].ex_type)
                            pd_error(x, "expr: type mismatch");
                }
                else if (argv[i].a_type == A_SYMBOL)
                {
                        if (x->exp_var[i].ex_type == ET_SI)
                                x->exp_var[i].ex_ptr = (char *)argv[i].a_w.w_symbol;
                        else if (x->exp_var[i].ex_type)
                            pd_error(x, "expr: type mismatch");
                }
        }
        expr_bang(x);
}